

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegxParser.cpp
# Opt level: O3

void __thiscall xercesc_4_0::RegxParser::processNext(RegxParser *this)

{
  ulong uVar1;
  XMLCh XVar2;
  ulong uVar3;
  ulong uVar4;
  XMLCh *pXVar5;
  ParseException *this_00;
  undefined4 *puVar6;
  parserState pVar7;
  uint uVar8;
  
  uVar3 = this->fOffset;
  uVar4 = this->fStringLen;
  if (uVar4 <= uVar3) {
    this->fCharData = -1;
    pVar7 = REGX_T_EOF;
    goto LAB_0023f513;
  }
  pXVar5 = this->fString;
  uVar1 = uVar3 + 1;
  this->fOffset = uVar1;
  XVar2 = pXVar5[uVar3];
  this->fCharData = (uint)(ushort)XVar2;
  uVar8 = (uint)(ushort)XVar2;
  if (this->fParseContext == regexParserStateInBrackets) {
    if (uVar8 == 0x2d) {
      pVar7 = REGX_T_CHAR;
      if ((uVar1 < uVar4) && (pXVar5[uVar3 + 1] == L'[')) {
        this->fOffset = uVar3 + 2;
        pVar7 = REGX_T_XMLSCHEMA_CC_SUBTRACTION;
      }
      goto LAB_0023f513;
    }
    if (uVar8 == 0x5c) {
      if (uVar4 <= uVar1) {
        this_00 = (ParseException *)__cxa_allocate_exception(0x30);
        ParseException::ParseException
                  (this_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/regx/RegxParser.cpp"
                   ,0x93,Parser_Next1,this->fMemoryManager);
LAB_0023f69b:
        __cxa_throw(this_00,&ParseException::typeinfo,XMLException::~XMLException);
      }
LAB_0023f4f0:
      this->fOffset = uVar3 + 2;
      this->fCharData = (uint)(ushort)pXVar5[uVar3 + 1];
      pVar7 = REGX_T_BACKSOLIDUS;
      goto LAB_0023f513;
    }
  }
  else {
    if ((ushort)XVar2 < 0x3f) {
      switch(XVar2) {
      case L'$':
        pVar7 = REGX_T_DOLLAR;
        break;
      default:
        goto switchD_0023f539_caseD_25;
      case L'(':
        pVar7 = REGX_T_LPAREN;
        break;
      case L')':
        pVar7 = REGX_T_RPAREN;
        break;
      case L'*':
        pVar7 = REGX_T_STAR;
        break;
      case L'+':
        pVar7 = REGX_T_PLUS;
        break;
      case L'.':
        pVar7 = REGX_T_DOT;
      }
      goto LAB_0023f513;
    }
    if ((ushort)XVar2 < 0x5c) {
      if (XVar2 == L'?') {
        pVar7 = REGX_T_QUESTION;
        goto LAB_0023f513;
      }
      if (XVar2 == L'[') {
        pVar7 = REGX_T_LBRACKET;
        goto LAB_0023f513;
      }
    }
    else {
      if (XVar2 == L'\\') {
        if (uVar4 <= uVar1) {
          this_00 = (ParseException *)__cxa_allocate_exception(0x30);
          ParseException::ParseException
                    (this_00,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/regx/RegxParser.cpp"
                     ,0xd9,Parser_Next1,this->fMemoryManager);
          goto LAB_0023f69b;
        }
        goto LAB_0023f4f0;
      }
      if (XVar2 == L'^') {
        pVar7 = REGX_T_CARET;
        goto LAB_0023f513;
      }
      pVar7 = REGX_T_OR;
      if (XVar2 == L'|') goto LAB_0023f513;
    }
  }
switchD_0023f539_caseD_25:
  pVar7 = REGX_T_CHAR;
  if (uVar1 < uVar4 && (XVar2 & 0xfc00U) == 0xd800) {
    if (((ushort)pXVar5[uVar3 + 1] & 0xfc00) != 0xdc00) {
      puVar6 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar6 = 0xdf;
      __cxa_throw(puVar6,&XMLErrs::Codes::typeinfo,0);
    }
    this->fCharData = (uint)(ushort)pXVar5[uVar3 + 1] + uVar8 * 0x400 + -0x35fdc00;
    this->fOffset = uVar3 + 2;
  }
LAB_0023f513:
  this->fState = pVar7;
  return;
}

Assistant:

void RegxParser::processNext() {

    if (fOffset >= fStringLen) {

        fCharData = -1;
        fState = REGX_T_EOF;
        return;
    }

    parserState nextState;
    XMLCh ch = fString[fOffset++];
    fCharData = ch;

    if (fParseContext == regexParserStateInBrackets) {

        switch (ch) {
        case chBackSlash:
            nextState = REGX_T_BACKSOLIDUS;

            if (fOffset >= fStringLen) {
                ThrowXMLwithMemMgr(ParseException,XMLExcepts::Parser_Next1, fMemoryManager);
            }

            fCharData = fString[fOffset++];
            break;
        case chDash:
            if (fOffset < fStringLen && fString[fOffset] == chOpenSquare) {

                fOffset++;
                nextState = REGX_T_XMLSCHEMA_CC_SUBTRACTION;
            }
            else {
                nextState = REGX_T_CHAR;
            }
            break;
        default:
            if (RegxUtil::isHighSurrogate(ch) && fOffset < fStringLen) {

                XMLCh lowCh = fString[fOffset];
                if (RegxUtil::isLowSurrogate(lowCh)) {
                    fCharData = RegxUtil::composeFromSurrogate(ch, lowCh);
                    fOffset++;
                }
                else {
                    throw XMLErrs::Expected2ndSurrogateChar;
                }
            }

            nextState = REGX_T_CHAR;
        }

        fState = nextState;
        return;
    }

    switch (ch) {

    case chPipe:
        nextState = REGX_T_OR;
        break;
    case chAsterisk:
        nextState = REGX_T_STAR;
        break;
    case chPlus:
        nextState = REGX_T_PLUS;
        break;
    case chQuestion:
        nextState = REGX_T_QUESTION;
        break;
    case chCloseParen:
        nextState = REGX_T_RPAREN;
        break;
    case chPeriod:
        nextState = REGX_T_DOT;
        break;
    case chOpenSquare:
        nextState = REGX_T_LBRACKET;
        break;
    case chCaret:
        nextState = REGX_T_CARET;
        break;
    case chDollarSign:
        nextState = REGX_T_DOLLAR;
        break;
    case chOpenParen:
        nextState = REGX_T_LPAREN;
        break;
    case chBackSlash:
        nextState = REGX_T_BACKSOLIDUS;
        if (fOffset >= fStringLen) {
            ThrowXMLwithMemMgr(ParseException,XMLExcepts::Parser_Next1, fMemoryManager);
        }

        fCharData = fString[fOffset++];
        break;
    default:
        nextState = REGX_T_CHAR;
        if (RegxUtil::isHighSurrogate(ch) && fOffset < fStringLen) {

                XMLCh lowCh = fString[fOffset];
                if (RegxUtil::isLowSurrogate(lowCh)) {
                    fCharData = RegxUtil::composeFromSurrogate(ch, lowCh);
                    fOffset++;
                }
                else {
                    throw XMLErrs::Expected2ndSurrogateChar;
                }
            }
    }

    fState = nextState;
}